

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

SimpleString __thiscall JUnitTestOutput::createFileName(JUnitTestOutput *this,SimpleString *group)

{
  bool bVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  SimpleString SVar2;
  SimpleString fileName;
  SimpleString SStack_48;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&SStack_48,"cpputest_");
  bVar1 = SimpleString::isEmpty((SimpleString *)(group[2].buffer_ + 0x50));
  if (!bVar1) {
    SimpleString::operator+=(&SStack_48,(SimpleString *)(group[2].buffer_ + 0x50));
    SimpleString::operator+=(&SStack_48,"_");
  }
  SimpleString::operator+=(&SStack_48,in_RDX);
  (**(code **)(group->buffer_ + 0x108))(&local_28,group,&SStack_48);
  SimpleString::SimpleString(&local_38,".xml");
  SimpleString::operator+((SimpleString *)this,&local_28);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_48);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::createFileName(const SimpleString& group)
{
    SimpleString fileName = "cpputest_";
    if (!impl_->package_.isEmpty()) {
        fileName += impl_->package_;
        fileName += "_";
    }
    fileName += group;
    return encodeFileName(fileName) + ".xml";
}